

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

char duckdb::TryCastCInternal<char*,signed_char,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
               (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  char cVar2;
  undefined8 in_RAX;
  char result_value;
  char local_1;
  
  local_1 = (char)((ulong)in_RAX >> 0x38);
  bVar1 = FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,signed_char>
                    (*(char **)((long)result->deprecated_columns[col].deprecated_data + row * 8),
                     &local_1);
  cVar2 = '\0';
  if (bVar1) {
    cVar2 = local_1;
  }
  return cVar2;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}